

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O3

void __thiscall cmMakefile::IncludeScope::~IncludeScope(IncludeScope *this)

{
  pointer pbVar1;
  pointer pcVar2;
  bool bVar3;
  
  PopPolicyBarrier(this->Makefile,this->ReportError);
  if (this->NoPolicyScope == false) {
    if (this->CheckCMP0011 == true) {
      bVar3 = cmPolicies::PolicyMap::IsEmpty
                        (&(this->Makefile->PolicyStack).
                          super__Vector_base<cmMakefile::PolicyStackEntry,_std::allocator<cmMakefile::PolicyStackEntry>_>
                          ._M_impl.super__Vector_impl_data._M_finish[-1].super_PolicyMap);
      if (bVar3) {
        this->CheckCMP0011 = false;
      }
    }
    PopPolicy(this->Makefile);
    if (this->CheckCMP0011 == true) {
      EnforceCMP0011(this);
    }
  }
  pbVar1 = (this->Makefile->ListFileStack).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  (this->Makefile->ListFileStack).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = pbVar1 + -1;
  pcVar2 = pbVar1[-1]._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != &pbVar1[-1].field_2) {
    operator_delete(pcVar2,pbVar1[-1].field_2._M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

cmMakefile::IncludeScope::~IncludeScope()
{
  // Enforce matching policy scopes inside the included file.
  this->Makefile->PopPolicyBarrier(this->ReportError);

  if(!this->NoPolicyScope)
    {
    // If we need to enforce policy CMP0011 then the top entry is the
    // one we pushed above.  If the entry is empty, then the included
    // script did not set any policies that might affect the includer so
    // we do not need to enforce the policy.
    if(this->CheckCMP0011 && this->Makefile->PolicyStack.back().IsEmpty())
      {
      this->CheckCMP0011 = false;
      }

    // Pop the scope we pushed for the script.
    this->Makefile->PopPolicy();

    // We enforce the policy after the script's policy stack entry has
    // been removed.
    if(this->CheckCMP0011)
      {
      this->EnforceCMP0011();
      }
    }
  this->Makefile->ListFileStack.pop_back();
}